

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O0

ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> * __thiscall
mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
          (ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *this,
          ValueMap<std::vector<int,_std::allocator<int>_>,_int> *m)

{
  bool bVar1;
  ValueNode *this_00;
  ValueMap<std::vector<int,_std::allocator<int>_>,_int> *in_RSI;
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_>,_bool> pVar2;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> *a2;
  const_iterator __end0;
  const_iterator __begin0;
  MapType *__range3;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  _Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_> in_stack_fffffffffffffe70;
  value_type *__x;
  BasicValuePresolver *in_stack_fffffffffffffeb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffec0;
  _Self local_28;
  _Self local_20;
  MapType *local_18;
  
  local_18 = ValueMap<std::vector<int,_std::allocator<int>_>,_int>::GetMap(in_RSI);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::begin((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = (ValueNode *)
              std::
              _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
              ::operator*((_Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)in_stack_fffffffffffffe70._M_node);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffec0,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8);
    __x = (value_type *)&in_RDI->map_;
    CreateArray<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>(in_stack_fffffffffffffeb8);
    std::pair<const_int,_mp::pre::ValueNode>::pair<mp::pre::ValueNode,_true>
              ((pair<const_int,_mp::pre::ValueNode> *)in_stack_fffffffffffffe70._M_node,
               (int *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
               (ValueNode *)0x187f63);
    pVar2 = std::
            map<int,_mp::pre::ValueNode,_std::less<int>,_std::allocator<std::pair<const_int,_mp::pre::ValueNode>_>_>
            ::insert((map<int,_mp::pre::ValueNode,_std::less<int>,_std::allocator<std::pair<const_int,_mp::pre::ValueNode>_>_>
                      *)this_00,__x);
    in_stack_fffffffffffffe70 = pVar2.first._M_node;
    in_stack_fffffffffffffe6f = pVar2.second;
    std::_Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_> *)0x187fb9);
    ValueNode::operator=(this_00,(vector<int,_std::allocator<int>_> *)__x);
    std::pair<const_int,_mp::pre::ValueNode>::~pair((pair<const_int,_mp::pre::ValueNode> *)0x187fdc)
    ;
    ValueNode::~ValueNode((ValueNode *)in_stack_fffffffffffffe70._M_node);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::_Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_fffffffffffffe70._M_node);
  }
  return in_RDI;
}

Assistant:

ValueMap& operator=(const ValueMap<Array2>& m) {
    for (const auto& a2: m.GetMap())
      map_.insert({
                    a2.first, CreateArray<Array, Param>(prm_)
                  }).first->second =
          a2.second;
    return *this;
  }